

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_sub2_i32_s390x
               (TCGContext_conflict12 *tcg_ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 al,TCGv_i32 ah,
               TCGv_i32 bl,TCGv_i32 bh)

{
  uc_struct_conflict14 *uc;
  void *hook;
  _Bool _Var1;
  TCGv_i64 dest;
  TCGv_i64 dest_00;
  TCGOp *pTVar2;
  list_item *cur;
  uintptr_t o_1;
  uintptr_t o;
  
  uc = tcg_ctx->uc;
  cur = uc->hook[0x10].head;
  _Var1 = _hook_exists_bounded(cur,tcg_ctx->pc_start);
  if (_Var1) {
    for (; (cur != (list_item *)0x0 && (hook = cur->data, hook != (void *)0x0)); cur = cur->next) {
      if ((*(char *)((long)hook + 0x14) == '\0') &&
         ((*(int *)((long)hook + 0xc) == 0 && (*(int *)((long)hook + 0x10) == 0)))) {
        dest = tcg_temp_new_i64(tcg_ctx);
        dest_00 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_concat_i32_i64_s390x(tcg_ctx,dest,al,ah);
        tcg_gen_concat_i32_i64_s390x(tcg_ctx,dest_00,bl,bh);
        gen_uc_traceopcode(tcg_ctx,hook,dest,dest_00,0x20,uc,tcg_ctx->pc_start);
        tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dest + (long)tcg_ctx));
        tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dest_00 + (long)tcg_ctx));
      }
    }
  }
  pTVar2 = tcg_emit_op_s390x(tcg_ctx,INDEX_op_sub2_i32);
  pTVar2->args[0] = (TCGArg)(rl + (long)tcg_ctx);
  pTVar2->args[1] = (TCGArg)(rh + (long)tcg_ctx);
  pTVar2->args[2] = (TCGArg)(al + (long)tcg_ctx);
  pTVar2->args[3] = (TCGArg)(ah + (long)tcg_ctx);
  pTVar2->args[4] = (TCGArg)(bl + (long)tcg_ctx);
  pTVar2->args[5] = (TCGArg)(bh + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_sub2_i32(TCGContext *tcg_ctx, TCGv_i32 rl, TCGv_i32 rh, TCGv_i32 al,
                      TCGv_i32 ah, TCGv_i32 bl, TCGv_i32 bh)
{
    uc_engine *uc = tcg_ctx->uc;

    if (TCG_TARGET_HAS_sub2_i32) {
        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_TCG_OPCODE, tcg_ctx->pc_start)) {
            struct hook *hook;
            HOOK_FOREACH_VAR_DECLARE;
            HOOK_FOREACH(uc, hook, UC_HOOK_TCG_OPCODE) {
                if (hook->to_delete)
                    continue;
                if (hook->op == UC_TCG_OP_SUB && hook->op_flags == 0) {
                    // Calling tcg_gen_sub_i64 will cause infinite recursion.
                    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
                    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
                    tcg_gen_concat_i32_i64(tcg_ctx, t0, al, ah);
                    tcg_gen_concat_i32_i64(tcg_ctx, t1, bl, bh);
                    gen_uc_traceopcode(tcg_ctx, hook, t0, t1, 32, uc, tcg_ctx->pc_start);
                    tcg_temp_free_i64(tcg_ctx, t0);
                    tcg_temp_free_i64(tcg_ctx, t1);
                }
            }
        }
        tcg_gen_op6_i32(tcg_ctx, INDEX_op_sub2_i32, rl, rh, al, ah, bl, bh);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_concat_i32_i64(tcg_ctx, t0, al, ah);
        tcg_gen_concat_i32_i64(tcg_ctx, t1, bl, bh);
        tcg_gen_sub_i64(tcg_ctx, t0, t0, t1);
        tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    }
}